

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

void recall_tree_ns::save_load_tree(recall_tree *b,io_buf *model_file,bool read,bool text)

{
  ostream *poVar1;
  uint32_t k;
  uint uVar2;
  ulong uVar3;
  uint32_t j;
  ulong uVar4;
  node_pred *data;
  node *data_00;
  v_array<recall_tree_ns::node_pred> *this;
  size_t n_preds;
  size_t n_nodes;
  v_array<recall_tree_ns::node> *local_228;
  node *local_220;
  ulong local_218;
  stringstream msg;
  ostream local_200;
  node local_88;
  
  if ((model_file->files)._end != (model_file->files)._begin) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar1 = std::operator<<(&local_200,"k");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," ");
    bin_text_read_write_fixed(model_file,(char *)&b->k,4,"",read,&msg,text);
    poVar1 = std::operator<<(&local_200,"node_only");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::operator<<(poVar1," ");
    bin_text_read_write_fixed(model_file,&b->node_only,1,"",read,&msg,text);
    n_nodes = ((long)(b->nodes)._end - (long)(b->nodes)._begin) / 0x58;
    poVar1 = std::operator<<(&local_200,"nodes");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," ");
    bin_text_read_write_fixed(model_file,(char *)&n_nodes,8,"",read,&msg,text);
    local_228 = &b->nodes;
    if (read) {
      v_array<recall_tree_ns::node>::clear(local_228);
      for (uVar4 = 0; uVar4 < n_nodes; uVar4 = (ulong)((int)uVar4 + 1)) {
        local_88._8_4_ = local_88._8_4_ & 0xffffff00;
        local_88.parent = 0;
        local_88.recall_lbest = 0.0;
        local_88.depth = 0;
        local_88.base_router = 0;
        local_88.left = 0;
        local_88.right = 0;
        local_88.n = 0.0;
        local_88.entropy = 0.0;
        local_88.passes = 1.0;
        local_88.preds.end_array = (node_pred *)0x0;
        local_88.preds.erase_count = 0;
        local_88.preds._begin = (node_pred *)0x0;
        local_88.preds._end = (node_pred *)0x0;
        v_array<recall_tree_ns::node>::push_back(local_228,&local_88);
      }
    }
    poVar1 = std::operator<<(&local_200,"max_candidates");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," ");
    bin_text_read_write_fixed(model_file,(char *)&b->max_candidates,8,"",read,&msg,text);
    poVar1 = std::operator<<(&local_200,"max_depth");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," ");
    bin_text_read_write_fixed(model_file,(char *)&b->max_depth,8,"",read,&msg,text);
    uVar2 = 0;
    while (uVar4 = (ulong)uVar2, uVar4 < n_nodes) {
      data_00 = local_228->_begin + uVar4;
      poVar1 = std::operator<<(&local_200,"parent");
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," ");
      bin_text_read_write_fixed(model_file,(char *)data_00,4,"",read,&msg,text);
      poVar1 = std::operator<<(&local_200,"recall_lbest");
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,data_00->recall_lbest);
      std::operator<<(poVar1," ");
      bin_text_read_write_fixed(model_file,(char *)&data_00->recall_lbest,4,"",read,&msg,text);
      poVar1 = std::operator<<(&local_200,"internal");
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
      std::operator<<(poVar1," ");
      bin_text_read_write_fixed(model_file,&data_00->internal,1,"",read,&msg,text);
      poVar1 = std::operator<<(&local_200,"depth");
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," ");
      bin_text_read_write_fixed(model_file,(char *)&data_00->depth,4,"",read,&msg,text);
      poVar1 = std::operator<<(&local_200,"base_router");
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," ");
      bin_text_read_write_fixed(model_file,(char *)&data_00->base_router,4,"",read,&msg,text);
      poVar1 = std::operator<<(&local_200,"left");
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," ");
      bin_text_read_write_fixed(model_file,(char *)&data_00->left,4,"",read,&msg,text);
      poVar1 = std::operator<<(&local_200,"right");
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," ");
      bin_text_read_write_fixed(model_file,(char *)&data_00->right,4,"",read,&msg,text);
      poVar1 = std::operator<<(&local_200,"n");
      std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<double>(data_00->n);
      std::operator<<(poVar1," ");
      bin_text_read_write_fixed(model_file,(char *)&data_00->n,8,"",read,&msg,text);
      poVar1 = std::operator<<(&local_200,"entropy");
      std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<double>(data_00->entropy);
      std::operator<<(poVar1," ");
      bin_text_read_write_fixed(model_file,(char *)&data_00->entropy,8,"",read,&msg,text);
      poVar1 = std::operator<<(&local_200,"passes");
      std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<double>(data_00->passes);
      std::operator<<(poVar1," ");
      bin_text_read_write_fixed(model_file,(char *)&data_00->passes,8,"",read,&msg,text);
      n_preds = (long)(data_00->preds)._end - (long)(data_00->preds)._begin >> 4;
      poVar1 = std::operator<<(&local_200,"n_preds");
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," ");
      bin_text_read_write_fixed(model_file,(char *)&n_preds,8,"",read,&msg,text);
      this = &data_00->preds;
      local_220 = data_00;
      if (read) {
        v_array<recall_tree_ns::node_pred>::clear(this);
        for (uVar3 = 0; uVar3 < n_preds; uVar3 = (ulong)((int)uVar3 + 1)) {
          local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
          local_88._8_4_ = 0;
          local_88.depth = 0;
          v_array<recall_tree_ns::node_pred>::push_back(this,(node_pred *)&local_88);
        }
      }
      local_218 = uVar4;
      for (uVar2 = 0; uVar2 < n_preds; uVar2 = uVar2 + 1) {
        data = this->_begin + uVar2;
        poVar1 = std::operator<<(&local_200,"label");
        poVar1 = std::operator<<(poVar1," = ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(poVar1," ");
        bin_text_read_write_fixed(model_file,(char *)data,4,"",read,&msg,text);
        poVar1 = std::operator<<(&local_200,"label_count");
        std::operator<<(poVar1," = ");
        poVar1 = std::ostream::_M_insert<double>(data->label_count);
        std::operator<<(poVar1," ");
        bin_text_read_write_fixed(model_file,(char *)&data->label_count,8,"",read,&msg,text);
      }
      if (read) {
        compute_recall_lbest(b,local_220);
      }
      uVar2 = (int)local_218 + 1;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  return;
}

Assistant:

void save_load_tree(recall_tree& b, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() > 0)
  {
    stringstream msg;

    writeit(b.k, "k");
    writeit(b.node_only, "node_only");
    writeitvar(b.nodes.size(), "nodes", n_nodes);

    if (read)
    {
      b.nodes.clear();
      for (uint32_t j = 0; j < n_nodes; ++j)
      {
        b.nodes.push_back(node());
      }
    }

    writeit(b.max_candidates, "max_candidates");
    writeit(b.max_depth, "max_depth");

    for (uint32_t j = 0; j < n_nodes; ++j)
    {
      node* cn = &b.nodes[j];

      writeit(cn->parent, "parent");
      writeit(cn->recall_lbest, "recall_lbest");
      writeit(cn->internal, "internal");
      writeit(cn->depth, "depth");
      writeit(cn->base_router, "base_router");
      writeit(cn->left, "left");
      writeit(cn->right, "right");
      writeit(cn->n, "n");
      writeit(cn->entropy, "entropy");
      writeit(cn->passes, "passes");

      writeitvar(cn->preds.size(), "n_preds", n_preds);

      if (read)
      {
        cn->preds.clear();

        for (uint32_t k = 0; k < n_preds; ++k)
        {
          cn->preds.push_back(node_pred(0));
        }
      }

      for (uint32_t k = 0; k < n_preds; ++k)
      {
        node_pred* pred = &cn->preds[k];

        writeit(pred->label, "label");
        writeit(pred->label_count, "label_count");
      }

      if (read)
      {
        compute_recall_lbest(b, cn);
      }
    }
  }
}